

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MahonyAHRS.c
# Opt level: O3

void MahonyAHRSupdateIMU(double gx,double gy,double gz,double ax,double ay,double az)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  
  if ((((ax != 0.0) || (NAN(ax))) || (ay != 0.0)) || (((NAN(ay) || (az != 0.0)) || (NAN(az))))) {
    dVar2 = az * az + ax * ax + ay * ay;
    dVar1 = (double)(0x5f3759df - ((long)dVar2 >> 1));
    dVar1 = (dVar2 * -0.5 * dVar1 * dVar1 + 1.5) * dVar1;
    dVar5 = q3 * q2 + q1 * q0;
    dVar6 = -q0 * q2 + q3 * q1;
    dVar4 = q3 * q3 + q0 * q0 + -0.5;
    dVar2 = ay * dVar1 * dVar4 - az * dVar1 * dVar5;
    dVar5 = ax * dVar1 * dVar5 - dVar6 * ay * dVar1;
    dVar1 = az * dVar1 * dVar6 - dVar4 * ax * dVar1;
    if (twoKi <= 0.0) {
      integralFBx = 0.0;
      integralFBy = 0.0;
      integralFBz = 0.0;
    }
    else {
      integralFBx = twoKi * dVar2 * 5.0 + integralFBx;
      integralFBy = dVar1 * twoKi * 5.0 + integralFBy;
      integralFBz = twoKi * dVar5 * 5.0 + integralFBz;
      gx = gx + integralFBx;
      gz = gz + integralFBz;
      gy = gy + integralFBy;
    }
    gx = gx + dVar2 * twoKp;
    gz = gz + twoKp * dVar5;
    gy = gy + twoKp * dVar1;
  }
  dVar1 = gx * 2.5;
  dVar5 = gy * 2.5;
  dVar4 = gz * 2.5;
  dVar3 = ((-q1 * dVar1 - dVar5 * q2) - q3 * dVar4) + q0;
  dVar6 = ((q0 * dVar1 + dVar4 * q2) - q3 * dVar5) + q1;
  dVar2 = dVar1 * q3 + (q0 * dVar5 - dVar4 * q1) + q2;
  dVar4 = ((dVar4 * q0 + dVar5 * q1) - q2 * dVar1) + q3;
  dVar5 = dVar4 * dVar4 + dVar2 * dVar2 + dVar6 * dVar6 + dVar3 * dVar3;
  dVar1 = (double)(0x5f3759df - ((long)dVar5 >> 1));
  dVar1 = (dVar5 * -0.5 * dVar1 * dVar1 + 1.5) * dVar1;
  q0 = dVar3 * dVar1;
  q1 = dVar6 * dVar1;
  q2 = dVar2 * dVar1;
  q3 = dVar1 * dVar4;
  return;
}

Assistant:

void MahonyAHRSupdateIMU(double gx, double gy, double gz, double ax, double ay, double az) {
    double recipNorm;
    double halfvx, halfvy, halfvz;
    double halfex, halfey, halfez;
    double qa, qb, qc;

    // Compute feedback only if accelerometer measurement valid (avoids NaN in accelerometer normalisation)
    if(!((ax == 0.0f) && (ay == 0.0f) && (az == 0.0f))) {

        // Normalise accelerometer measurement
        recipNorm = invSqrt(ax * ax + ay * ay + az * az);
        ax *= recipNorm;
        ay *= recipNorm;
        az *= recipNorm;

        // Estimated direction of gravity and vector perpendicular to magnetic flux
        halfvx = q1 * q3 - q0 * q2;
        halfvy = q0 * q1 + q2 * q3;
        halfvz = q0 * q0 - 0.5f + q3 * q3;

        // Error is sum of cross product between estimated and measured direction of gravity
        halfex = (ay * halfvz - az * halfvy);
        halfey = (az * halfvx - ax * halfvz);
        halfez = (ax * halfvy - ay * halfvx);

        // Compute and apply integral feedback if enabled
        if(twoKi > 0.0f) {
            integralFBx += twoKi * halfex * (1.0f / sampleFreq);	// integral error scaled by Ki
            integralFBy += twoKi * halfey * (1.0f / sampleFreq);
            integralFBz += twoKi * halfez * (1.0f / sampleFreq);
            gx += integralFBx;	// apply integral feedback
            gy += integralFBy;
            gz += integralFBz;
        }
        else {
            integralFBx = 0.0f;	// prevent integral windup
            integralFBy = 0.0f;
            integralFBz = 0.0f;
        }

        // Apply proportional feedback
        gx += twoKp * halfex;
        gy += twoKp * halfey;
        gz += twoKp * halfez;
    }

    // Integrate rate of change of quaternion
    gx *= (0.5f * (1.0f / sampleFreq));		// pre-multiply common factors
    gy *= (0.5f * (1.0f / sampleFreq));
    gz *= (0.5f * (1.0f / sampleFreq));
    qa = q0;
    qb = q1;
    qc = q2;
    q0 += (-qb * gx - qc * gy - q3 * gz);
    q1 += (qa * gx + qc * gz - q3 * gy);
    q2 += (qa * gy - qb * gz + q3 * gx);
    q3 += (qa * gz + qb * gy - qc * gx);

    // Normalise quaternion
    recipNorm = invSqrt(q0 * q0 + q1 * q1 + q2 * q2 + q3 * q3);
    q0 *= recipNorm;
    q1 *= recipNorm;
    q2 *= recipNorm;
    q3 *= recipNorm;
}